

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O3

void __thiscall
duckdb::RadixPartitionedTupleData::InitializeAppendStateInternal
          (RadixPartitionedTupleData *this,PartitionedTupleDataAppendState *state,
          TupleDataPinProperties properties)

{
  unsafe_vector<TupleDataPinState> *this_00;
  pointer *ppTVar1;
  iterator __position;
  TupleDataLayout *pTVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pTVar5;
  long lVar6;
  long lVar7;
  size_type __n;
  ulong __n_00;
  vector<unsigned_long,_true> column_ids;
  unsigned_long local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<unsigned_long,_true> local_48;
  
  __n = 1L << ((byte)this->radix_bits & 0x3f);
  this_00 = &state->partition_pin_states;
  std::vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>::reserve
            ((vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_> *)
             this_00,__n);
  lVar6 = 0;
  lVar7 = 0;
  do {
    __position._M_current =
         (state->partition_pin_states).
         super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
         super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (state->partition_pin_states).
        super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
        super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>::
      _M_realloc_insert<>((vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                           *)this_00,__position);
    }
    else {
      ((__position._M_current)->heap_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->heap_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((__position._M_current)->row_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((__position._M_current)->heap_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->row_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->row_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)&(__position._M_current)->properties = 0;
      ppTVar1 = &(state->partition_pin_states).
                 super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                 .
                 super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    pTVar5 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
             ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                           *)((long)&(((this->super_PartitionedTupleData).partitions.
                                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                     )._M_t + lVar7));
    TupleDataCollection::InitializeAppend
              (pTVar5,(TupleDataPinState *)
                      ((long)&((this_00->
                               super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                               ).
                               super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                               ._M_impl.super__Vector_impl_data._M_start)->row_handles + lVar6),
               properties);
    lVar7 = lVar7 + 8;
    lVar6 = lVar6 + 0x38;
    __n = __n - 1;
  } while (__n != 0);
  pTVar2 = (this->super_PartitionedTupleData).layout;
  pLVar3 = (pTVar2->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar4 = (pTVar2->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n_00 = ((long)pLVar4 - (long)pLVar3 >> 3) * -0x5555555555555555;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,__n_00);
  local_70 = 0;
  if (pLVar4 != pLVar3) {
    do {
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_70;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_70 = local_70 + 1;
    } while (local_70 < __n_00);
  }
  pTVar5 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
           ::operator->((this->super_PartitionedTupleData).partitions.
                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TupleDataCollection::InitializeChunkState(pTVar5,&state->chunk_state,&local_48);
  if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  fixed_size_map_t<duckdb::list_entry_t>::resize
            (&state->fixed_partition_entries,1L << ((byte)this->radix_bits & 0x3f));
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RadixPartitionedTupleData::InitializeAppendStateInternal(PartitionedTupleDataAppendState &state,
                                                              const TupleDataPinProperties properties) const {
	// Init pin state per partition
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	state.partition_pin_states.reserve(num_partitions);
	for (idx_t i = 0; i < num_partitions; i++) {
		state.partition_pin_states.emplace_back();
		partitions[i]->InitializeAppend(state.partition_pin_states[i], properties);
	}

	// Init single chunk state
	auto column_count = layout.ColumnCount();
	vector<column_t> column_ids;
	column_ids.reserve(column_count);
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		column_ids.emplace_back(col_idx);
	}
	partitions[0]->InitializeChunkState(state.chunk_state, std::move(column_ids));

	// Initialize fixed-size map
	state.fixed_partition_entries.resize(RadixPartitioning::NumberOfPartitions(radix_bits));
}